

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

CSVError * __thiscall
duckdb::CSVError::CastError
          (CSVError *__return_storage_ptr__,CSVError *this,CSVReaderOptions *options,
          string *column_name,string *cast_error,idx_t column_idx,string *csv_row,
          LinesPerBoundary error_info,idx_t row_byte_position,optional_idx byte_position,
          LogicalTypeId type,string *current_path)

{
  LinesPerBoundary error_info_p;
  CSVError *pCVar1;
  const_reference cVar2;
  ostream *poVar3;
  LogicalTypeId type_00;
  undefined7 in_stack_00000031;
  ostringstream how_to_fix_it;
  ostringstream error;
  char local_3a1;
  string local_3a0;
  CSVError *local_380;
  string local_378;
  string *local_358;
  idx_t iStack_350;
  string local_340;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_380 = __return_storage_ptr__;
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error when converting column \"",0x1e);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,
                      *(char **)&(options->dialect_options).state_machine_options.delimiter,
                      (long)(options->dialect_options).state_machine_options.delimiter.value.
                            _M_dataplus._M_p);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\". ",3);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(column_name->_M_dataplus)._M_p,
                      column_name->_M_string_length);
  local_320[0] = (ostringstream)0xa;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_320,1);
  ::std::__cxx11::ostringstream::ostringstream(local_320);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Column ",7);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,
                      *(char **)&(options->dialect_options).state_machine_options.delimiter,
                      (long)(options->dialect_options).state_machine_options.delimiter.value.
                            _M_dataplus._M_p);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," is being converted as type ",0x1c);
  LogicalTypeIdToString_abi_cxx11_(&local_3a0,(duckdb *)(byte_position.index & 0xff),type_00);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)CONCAT71(local_3a0._M_dataplus._M_p._1_7_,
                                              local_3a0._M_dataplus._M_p._0_1_),
                      local_3a0._M_string_length);
  local_3a1 = '\n';
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_3a1,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_3a0._M_dataplus._M_p._1_7_,local_3a0._M_dataplus._M_p._0_1_) !=
      &local_3a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_3a0._M_dataplus._M_p._1_7_,local_3a0._M_dataplus._M_p._0_1_));
  }
  if (cast_error <
      (string *)
      ((ulong)(uint)this[3].full_error_message._M_string_length +
      ((long)this[3].full_error_message._M_dataplus._M_p -
      this[3].error_message.field_2._M_allocated_capacity) * 8)) {
    cVar2 = vector<bool,_true>::get<true>
                      ((vector<bool,_true> *)&this[3].error_message.field_2,(size_type)cast_error);
    if (cVar2) {
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,
                 "This type was either manually set or derived from an existing table. Select a different type to correctly parse this column."
                 ,0x7c);
      local_3a0._M_dataplus._M_p._0_1_ = 10;
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,(char *)&local_3a0,1);
      goto LAB_00ba5d70;
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"This type was auto-detected from the CSV file.",0x2e);
  local_3a0._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_3a0,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"Possible solutions:",0x13);
  local_3a0._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_3a0,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "* Override the type for this column manually by setting the type explicitly, e.g. types={\'"
             ,0x5a);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,
                      *(char **)&(options->dialect_options).state_machine_options.delimiter,
                      (long)(options->dialect_options).state_machine_options.delimiter.value.
                            _M_dataplus._M_p);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\': \'VARCHAR\'}",0xd);
  local_3a0._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_3a0,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "* Set the sample size to a larger value to enable the auto-detection to scan more values, e.g. sample_size=-1"
             ,0x6d);
  local_3a0._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_3a0,1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "* Use a COPY statement to automatically derive types from an existing table.",0x4c);
  local_3a0._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_3a0,1);
LAB_00ba5d70:
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "* Check whether the null string value is set correctly (e.g., nullstr = \'N/A\')",0x4e
            );
  local_3a0._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_3a0,1);
  ::std::__cxx11::stringbuf::str();
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,*(long *)column_idx,
             *(long *)(column_idx + 8) + *(long *)column_idx);
  local_358 = csv_row;
  iStack_350 = error_info.boundary_idx;
  ::std::__cxx11::stringbuf::str();
  pCVar1 = local_380;
  error_info_p.lines_in_batch = iStack_350;
  error_info_p.boundary_idx = (idx_t)local_358;
  CSVError(local_380,&local_340,CAST_ERROR,(idx_t)cast_error,&local_378,error_info_p,
           error_info.lines_in_batch,(optional_idx)row_byte_position,(CSVReaderOptions *)this,
           &local_3a0,(string *)CONCAT71(in_stack_00000031,type));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_3a0._M_dataplus._M_p._1_7_,local_3a0._M_dataplus._M_p._0_1_) !=
      &local_3a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_3a0._M_dataplus._M_p._1_7_,local_3a0._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_320);
  ::std::ios_base::~ios_base(local_2b0);
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return pCVar1;
}

Assistant:

CSVError CSVError::CastError(const CSVReaderOptions &options, const string &column_name, string &cast_error,
                             idx_t column_idx, string &csv_row, LinesPerBoundary error_info, idx_t row_byte_position,
                             optional_idx byte_position, LogicalTypeId type, const string &current_path) {
	std::ostringstream error;
	// Which column
	error << "Error when converting column \"" << column_name << "\". ";
	// What was the cast error
	error << cast_error << '\n';
	std::ostringstream how_to_fix_it;
	how_to_fix_it << "Column " << column_name << " is being converted as type " << LogicalTypeIdToString(type) << '\n';
	if (!options.WasTypeManuallySet(column_idx)) {
		how_to_fix_it << "This type was auto-detected from the CSV file." << '\n';
		how_to_fix_it << "Possible solutions:" << '\n';
		how_to_fix_it << "* Override the type for this column manually by setting the type explicitly, e.g. types={'"
		              << column_name << "': 'VARCHAR'}" << '\n';
		how_to_fix_it
		    << "* Set the sample size to a larger value to enable the auto-detection to scan more values, e.g. "
		       "sample_size=-1"
		    << '\n';
		how_to_fix_it << "* Use a COPY statement to automatically derive types from an existing table." << '\n';
	} else {
		how_to_fix_it
		    << "This type was either manually set or derived from an existing table. Select a different type to "
		       "correctly parse this column."
		    << '\n';
	}
	how_to_fix_it << "* Check whether the null string value is set correctly (e.g., nullstr = 'N/A')" << '\n';

	return CSVError(error.str(), CAST_ERROR, column_idx, csv_row, error_info, row_byte_position, byte_position, options,
	                how_to_fix_it.str(), current_path);
}